

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodea.c
# Opt level: O2

int CVAhermiteStorePnt(CVodeMem cv_mem,CVdtpntMem d)

{
  uint uVar1;
  CVadjMemRec *pCVar2;
  undefined8 *puVar3;
  sunrealtype *psVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  
  pCVar2 = cv_mem->cv_adj_mem;
  puVar3 = (undefined8 *)d->content;
  N_VScale(0x3ff0000000000000,cv_mem->cv_zn[0],*puVar3);
  if (pCVar2->ca_IMstoreSensi != 0) {
    uVar1 = cv_mem->cv_Ns;
    uVar6 = 0;
    uVar7 = 0;
    if (0 < (int)uVar1) {
      uVar7 = (ulong)uVar1;
    }
    psVar4 = cv_mem->cv_cvals;
    for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      psVar4[uVar6] = 1.0;
    }
    iVar5 = N_VScaleVectorArray(uVar1,psVar4,cv_mem->cv_znS[0],puVar3[2]);
    if (iVar5 != 0) {
      return -0x1c;
    }
  }
  if (cv_mem->cv_nst == 0) {
    (*cv_mem->cv_f)(cv_mem->cv_tn,(N_Vector)*puVar3,(N_Vector)puVar3[1],cv_mem->cv_user_data);
    if (pCVar2->ca_IMstoreSensi != 0) {
      cvSensRhsWrapper(cv_mem,cv_mem->cv_tn,(N_Vector)*puVar3,(N_Vector)puVar3[1],
                       (N_Vector *)puVar3[2],(N_Vector *)puVar3[3],cv_mem->cv_tempv,cv_mem->cv_ftemp
                      );
    }
  }
  else {
    N_VScale(1.0 / cv_mem->cv_h,cv_mem->cv_zn[1]);
    if (pCVar2->ca_IMstoreSensi != 0) {
      uVar1 = cv_mem->cv_Ns;
      uVar6 = 0;
      uVar7 = 0;
      if (0 < (int)uVar1) {
        uVar7 = (ulong)uVar1;
      }
      for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
        cv_mem->cv_cvals[uVar6] = 1.0 / cv_mem->cv_h;
      }
      iVar5 = N_VScaleVectorArray(uVar1,cv_mem->cv_cvals,cv_mem->cv_znS[1],puVar3[3]);
      if (iVar5 != 0) {
        return -0x1c;
      }
    }
  }
  return 0;
}

Assistant:

static int CVAhermiteStorePnt(CVodeMem cv_mem, CVdtpntMem d)
{
  CVadjMem ca_mem;
  CVhermiteDataMem content;
  int is, retval;

  ca_mem = cv_mem->cv_adj_mem;

  content = (CVhermiteDataMem)d->content;

  /* Load solution */

  N_VScale(ONE, cv_mem->cv_zn[0], content->y);

  if (ca_mem->ca_IMstoreSensi)
  {
    for (is = 0; is < cv_mem->cv_Ns; is++) { cv_mem->cv_cvals[is] = ONE; }

    retval = N_VScaleVectorArray(cv_mem->cv_Ns, cv_mem->cv_cvals,
                                 cv_mem->cv_znS[0], content->yS);
    if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }
  }

  /* Load derivative */

  if (cv_mem->cv_nst == 0)
  {
    /* retval = */ cv_mem->cv_f(cv_mem->cv_tn, content->y, content->yd,
                                cv_mem->cv_user_data);

    if (ca_mem->ca_IMstoreSensi)
    {
      /* retval = */ cvSensRhsWrapper(cv_mem, cv_mem->cv_tn, content->y,
                                      content->yd, content->yS, content->ySd,
                                      cv_mem->cv_tempv, cv_mem->cv_ftemp);
    }
  }
  else
  {
    N_VScale(ONE / cv_mem->cv_h, cv_mem->cv_zn[1], content->yd);

    if (ca_mem->ca_IMstoreSensi)
    {
      for (is = 0; is < cv_mem->cv_Ns; is++)
      {
        cv_mem->cv_cvals[is] = ONE / cv_mem->cv_h;
      }

      retval = N_VScaleVectorArray(cv_mem->cv_Ns, cv_mem->cv_cvals,
                                   cv_mem->cv_znS[1], content->ySd);
      if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }
    }
  }

  return (0);
}